

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void enc_calc_subpel_params
               (MV *src_mv,InterPredParams *inter_pred_params,uint8_t **pre,
               SubpelParams *subpel_params,int *src_stride)

{
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  undefined4 *in_R8;
  SubpelParams *unaff_retaddr;
  buf_2d *pre_buf;
  
  init_subpel_params((MV *)src_stride,(InterPredParams *)pre_buf,unaff_retaddr,
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  *in_RDX = *(long *)(in_RSI + 0x88) +
            (long)((*(int *)(in_RCX + 0x14) >> 10) * *(int *)(in_RSI + 0x98)) +
            (long)(*(int *)(in_RCX + 0x10) >> 10);
  *in_R8 = *(undefined4 *)(in_RSI + 0x98);
  return;
}

Assistant:

static inline void enc_calc_subpel_params(
    const MV *const src_mv, InterPredParams *const inter_pred_params,
    uint8_t **pre, SubpelParams *subpel_params, int *src_stride) {
  struct buf_2d *pre_buf = &inter_pred_params->ref_frame_buf;
  init_subpel_params(src_mv, inter_pred_params, subpel_params, pre_buf->width,
                     pre_buf->height);
  *pre = pre_buf->buf0 +
         (subpel_params->pos_y >> SCALE_SUBPEL_BITS) * pre_buf->stride +
         (subpel_params->pos_x >> SCALE_SUBPEL_BITS);
  *src_stride = pre_buf->stride;
}